

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfrgload.c
# Opt level: O0

FT_Error pfr_glyph_line_to(PFR_Glyph glyph,FT_Vector *to)

{
  FT_GlyphLoader loader_00;
  int iVar1;
  FT_Vector *pFVar2;
  int local_34;
  FT_Error local_2c;
  FT_Int n;
  FT_Error error;
  FT_Outline *outline;
  FT_GlyphLoader loader;
  FT_Vector *to_local;
  PFR_Glyph glyph_local;
  
  loader_00 = glyph->loader;
  if (glyph->path_begun == '\0') {
    local_2c = 8;
  }
  else {
    if (loader_00->max_points <
        (int)(loader_00->base).outline.n_points + (int)(loader_00->current).outline.n_points + 1U) {
      local_34 = FT_GlyphLoader_CheckPoints(loader_00,1,0);
    }
    else {
      local_34 = 0;
    }
    local_2c = local_34;
    if (local_34 == 0) {
      iVar1 = (int)(loader_00->current).outline.n_points;
      pFVar2 = (loader_00->current).outline.points + iVar1;
      pFVar2->x = to->x;
      pFVar2->y = to->y;
      (loader_00->current).outline.tags[iVar1] = '\x01';
      (loader_00->current).outline.n_points = (loader_00->current).outline.n_points + 1;
    }
  }
  return local_2c;
}

Assistant:

static FT_Error
  pfr_glyph_line_to( PFR_Glyph   glyph,
                     FT_Vector*  to )
  {
    FT_GlyphLoader  loader  = glyph->loader;
    FT_Outline*     outline = &loader->current.outline;
    FT_Error        error;


    /* check that we have begun a new path */
    if ( !glyph->path_begun )
    {
      error = FT_THROW( Invalid_Table );
      FT_ERROR(( "pfr_glyph_line_to: invalid glyph data\n" ));
      goto Exit;
    }

    error = FT_GLYPHLOADER_CHECK_POINTS( loader, 1, 0 );
    if ( !error )
    {
      FT_Int  n = outline->n_points;


      outline->points[n] = *to;
      outline->tags  [n] = FT_CURVE_TAG_ON;

      outline->n_points++;
    }

  Exit:
    return error;
  }